

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

char * fai_fetch(faidx_t *fai,char *str,int *len)

{
  undefined4 uVar1;
  kh_s_t *h_00;
  undefined4 uVar4;
  long lVar2;
  uint64_t uVar3;
  khiter_t kVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  kh_cstr_t key;
  ushort **ppuVar9;
  faidx1_t *pfVar10;
  long local_80;
  int local_74;
  int ret;
  int n_hyphen;
  int end;
  int beg;
  kh_s_t *h;
  faidx1_t val;
  khiter_t iter;
  int name_end;
  int k;
  int l;
  int i;
  int c;
  char *s;
  int *len_local;
  char *str_local;
  faidx_t *fai_local;
  
  h_00 = fai->hash;
  sVar8 = strlen(str);
  val.offset._4_4_ = (khiter_t)sVar8;
  key = (kh_cstr_t)malloc((long)(int)(val.offset._4_4_ + 1));
  iter = 0;
  for (k = 0; kVar5 = iter, k < (int)val.offset._4_4_; k = k + 1) {
    ppuVar9 = __ctype_b_loc();
    if (((*ppuVar9)[(int)str[k]] & 0x2000) == 0) {
      key[(int)iter] = str[k];
      iter = iter + 1;
    }
  }
  key[(int)iter] = '\0';
  k = iter;
  do {
    k = k - 1;
    if (k < 0) break;
  } while (key[k] != ':');
  if (-1 < k) {
    val.offset._4_4_ = k;
  }
  if ((int)val.offset._4_4_ < (int)iter) {
    local_74 = 0;
    k = val.offset._4_4_;
    do {
      while( true ) {
        k = k + 1;
        if ((int)iter <= k) goto LAB_00150b0e;
        if (key[k] != '-') break;
        local_74 = local_74 + 1;
      }
      ppuVar9 = __ctype_b_loc();
    } while ((((*ppuVar9)[(int)key[k]] & 0x800) != 0) || (key[k] == ','));
LAB_00150b0e:
    if ((k < (int)iter) || (1 < local_74)) {
      val.offset._4_4_ = iter;
    }
    key[(int)val.offset._4_4_] = '\0';
    val.offset._0_4_ = kh_get_s(h_00,key);
    if ((khint_t)val.offset == h_00->n_buckets) {
      val.offset._0_4_ = kh_get_s(h_00,str);
      if ((khint_t)val.offset == h_00->n_buckets) {
        *len = 0;
        free(key);
        return (char *)0x0;
      }
      key[(int)val.offset._4_4_] = ':';
      val.offset._4_4_ = iter;
    }
  }
  else {
    val.offset._0_4_ = kh_get_s(h_00,str);
  }
  if ((khint_t)val.offset == h_00->n_buckets) {
    fprintf(_stderr,
            "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n"
            ,str);
    free(key);
    *len = -2;
    fai_local = (faidx_t *)0x0;
  }
  else {
    pfVar10 = h_00->vals + (khint_t)val.offset;
    uVar1 = pfVar10->line_len;
    uVar4 = pfVar10->line_blen;
    lVar2 = pfVar10->len;
    uVar3 = pfVar10->offset;
    iVar7 = (int)lVar2;
    if ((int)val.offset._4_4_ < (int)iter) {
      iter = val.offset._4_4_ + 1;
      for (k = iter; k < (int)kVar5; k = k + 1) {
        if (key[k] != ',') {
          key[(int)iter] = key[k];
          iter = iter + 1;
        }
      }
      key[(int)iter] = '\0';
      n_hyphen = atoi(key + (long)(int)val.offset._4_4_ + 1);
      do {
        k = val.offset._4_4_ + 1;
        if (k == iter) break;
        val.offset._4_4_ = k;
      } while (key[k] != '-');
      local_80 = lVar2;
      if (k < (int)iter) {
        iVar6 = atoi(key + (long)k + 1);
        local_80 = (long)iVar6;
      }
      ret = (int)local_80;
      if (0 < n_hyphen) {
        n_hyphen = n_hyphen + -1;
      }
    }
    else {
      n_hyphen = 0;
      ret = iVar7;
    }
    if (lVar2 <= n_hyphen) {
      n_hyphen = iVar7;
    }
    if (lVar2 <= ret) {
      ret = iVar7;
    }
    if (ret < n_hyphen) {
      n_hyphen = ret;
    }
    free(key);
    iVar7 = bgzf_useek(fai->bgzf,
                       uVar3 + (long)((n_hyphen / (int)uVar4) * uVar1) +
                       (long)(n_hyphen % (int)uVar4),0);
    if (iVar7 < 0) {
      *len = -1;
      fprintf(_stderr,
              "[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n"
             );
      fai_local = (faidx_t *)0x0;
    }
    else {
      name_end = 0;
      fai_local = (faidx_t *)malloc((long)((ret - n_hyphen) + 2));
      while (iVar7 = bgzf_getc(fai->bgzf), -1 < iVar7 && name_end < ret - n_hyphen) {
        ppuVar9 = __ctype_b_loc();
        if (((*ppuVar9)[iVar7] & 0x8000) != 0) {
          *(char *)((long)&fai_local->bgzf + (long)name_end) = (char)iVar7;
          name_end = name_end + 1;
        }
      }
      *(undefined1 *)((long)&fai_local->bgzf + (long)name_end) = 0;
      *len = name_end;
    }
  }
  return (char *)fai_local;
}

Assistant:

char *fai_fetch(const faidx_t *fai, const char *str, int *len)
{
    char *s;
    int c, i, l, k, name_end;
    khiter_t iter;
    faidx1_t val;
    khash_t(s) *h;
    int beg, end;

    beg = end = -1;
    h = fai->hash;
    name_end = l = strlen(str);
    s = (char*)malloc(l+1);
    // remove space
    for (i = k = 0; i < l; ++i)
        if (!isspace(str[i])) s[k++] = str[i];
    s[k] = 0; l = k;
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
        s[name_end] = 0;
        iter = kh_get(s, h, s);
        if (iter == kh_end(h)) { // cannot find the sequence name
            iter = kh_get(s, h, str); // try str as the name
            if (iter == kh_end(h)) {
                *len = 0;
            free(s); return 0;
            } else s[name_end] = ':', name_end = l;
        }
    } else iter = kh_get(s, h, str);
    if(iter == kh_end(h)) {
        fprintf(stderr, "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n", str);
        free(s);
        *len = -2;
        return 0;
    };
    val = kh_value(h, iter);
    // parse the interval
    if (name_end < l) {
        for (i = k = name_end + 1; i < l; ++i)
            if (s[i] != ',') s[k++] = s[i];
        s[k] = 0;
        beg = atoi(s + name_end + 1);
        for (i = name_end + 1; i != k; ++i) if (s[i] == '-') break;
        end = i < k? atoi(s + i + 1) : val.len;
        if (beg > 0) --beg;
    } else beg = 0, end = val.len;
    if (beg >= val.len) beg = val.len;
    if (end >= val.len) end = val.len;
    if (beg > end) beg = end;
    free(s);

    // now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + beg / val.line_blen * val.line_len + beg % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    s = (char*)malloc(end - beg + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < end - beg )
        if (isgraph(c)) s[l++] = c;
    s[l] = '\0';
    *len = l;
    return s;
}